

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

object_iterator __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::find_abi_cxx11_
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this,
          string_view_type *key)

{
  json_storage_kind jVar1;
  iterator ptr;
  undefined8 uVar2;
  undefined8 extraout_RDX;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  iterator iVar3;
  object_iterator oVar4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_00000010;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa1;
  char *in_stack_ffffffffffffffa8;
  not_an_object *in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffb9;
  string_view_type *in_stack_ffffffffffffffd8;
  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
  local_10;
  
  jVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::storage_kind(in_RDI);
  if (jVar1 == empty_object) {
    object_range_abi_cxx11_(in_stack_00000010);
    iVar3 = range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
            ::end((range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
                   *)&stack0xffffffffffffffc0);
    local_10.has_value_ = iVar3.has_value_;
  }
  else if (jVar1 == json_reference) {
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
              (in_stack_ffffffffffffff70);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::json_reference_storage::value
              ((json_reference_storage *)0x53b8ae);
    iVar3 = find_abi_cxx11_((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            in_RSI,in_stack_ffffffffffffffd8);
    local_10.has_value_ = iVar3.has_value_;
  }
  else {
    if (jVar1 != object) {
      uVar2 = __cxa_allocate_exception(0x58);
      std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
      std::basic_string_view<char,_std::char_traits<char>_>::length(in_RSI);
      not_an_object::not_an_object<char>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                 CONCAT71(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0));
      __cxa_throw(uVar2,&not_an_object::typeinfo,not_an_object::~not_an_object);
    }
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage>
              (in_stack_ffffffffffffff70);
    object_storage::value_abi_cxx11_((object_storage *)in_stack_ffffffffffffffb0);
    ptr = sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
          ::find((sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
                  *)CONCAT71(in_stack_ffffffffffffffb9,in_stack_ffffffffffffffb8),
                 (string_view_type *)in_stack_ffffffffffffffb0);
    detail::
    random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
    ::random_access_iterator_wrapper
              (&local_10,
               (__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                )ptr._M_current);
    iVar3._8_8_ = extraout_RDX;
    iVar3.it_._M_current = local_10.it_._M_current;
  }
  local_10.it_ = iVar3.it_._M_current;
  oVar4._9_7_ = iVar3._9_7_;
  oVar4.has_value_ = local_10.has_value_;
  oVar4.it_._M_current = local_10.it_._M_current;
  return oVar4;
}

Assistant:

object_iterator find(const string_view_type& key)
        {
            switch (storage_kind())
            {
                case json_storage_kind::empty_object:
                    return object_range().end();
                case json_storage_kind::object:
                    return object_iterator(cast<object_storage>().value().find(key));
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().find(key);
                default:
                    JSONCONS_THROW(not_an_object(key.data(),key.length()));
            }
        }